

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldResponseNackPdu.cpp
# Opt level: O0

void __thiscall
DIS::MinefieldResponseNackPdu::MinefieldResponseNackPdu(MinefieldResponseNackPdu *this)

{
  MinefieldResponseNackPdu *this_local;
  
  MinefieldFamilyPdu::MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  (this->super_MinefieldFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__MinefieldResponseNackPdu_002683f0;
  EntityID::EntityID(&this->_minefieldID);
  EntityID::EntityID(&this->_requestingEntityID);
  this->_requestID = '\0';
  this->_numberOfMissingPdus = '\0';
  std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::vector
            (&this->_missingPduSequenceNumbers);
  PduSuperclass::setPduType((PduSuperclass *)this,'(');
  return;
}

Assistant:

MinefieldResponseNackPdu::MinefieldResponseNackPdu() : MinefieldFamilyPdu(),
   _minefieldID(), 
   _requestingEntityID(), 
   _requestID(0), 
   _numberOfMissingPdus(0)
{
    setPduType( 40 );
}